

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_writer_mandatory.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  
  abuf_init(&dumpbuf);
  lVar3 = 0;
  do {
    tlv_value_buffer[lVar3] = (uint8_t)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  rfc5444_writer_init(&writer);
  rfc5444_writer_register_target(&writer,&small_if);
  rfc5444_writer_register_target(&writer,&large_if);
  lVar3 = rfc5444_writer_register_message(&writer,1,0);
  *(code **)(lVar3 + 0xd8) = addMessageHeader;
  *(code **)(lVar3 + 0xe0) = finishMessageHeader;
  rfc5444_writer_register_msgcontentprovider(&writer,&cpr,addrtlvs,1);
  BEGIN_TESTING(clear_elements);
  cunit_start_test("test_frag_80_1");
  tlvcount = 1;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x50;
  iVar1 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar1 == 0,"test_frag_80_1",0xac,"Parser should return 0");
  rfc5444_writer_flush(&writer,&small_if,0);
  rfc5444_writer_flush(&writer,&large_if,0);
  cunit_named_check(fragments == 1,"test_frag_80_1",0xb0,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 1,"test_frag_80_1",0xb1,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 1,"test_frag_80_1",0xb2,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_80_1");
  cunit_start_test("test_frag_80_2");
  tlvcount = 2;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x50;
  uVar2 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  uVar4 = rfc5444_strerror(uVar2);
  cunit_named_check(uVar2 == 0xfffffff4,"test_frag_80_2",0xc1,
                    "Parser should return RFC5444_MTU_TOO_SMALL: %s (%d)",uVar4,(ulong)uVar2);
  cunit_named_check(fragments == 0,"test_frag_80_2",0xc3,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 0,"test_frag_80_2",0xc4,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 0,"test_frag_80_2",0xc5,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_80_2");
  cunit_start_test("test_frag_50_3");
  tlvcount = 3;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x32;
  iVar1 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar1 == 0,"test_frag_50_3",0xd3,"Parser should return 0");
  rfc5444_writer_flush(&writer,&small_if,0);
  rfc5444_writer_flush(&writer,&large_if,0);
  cunit_named_check(fragments == 2,"test_frag_50_3",0xd7,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 2,"test_frag_50_3",0xd8,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 1,"test_frag_50_3",0xd9,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_50_3");
  rfc5444_writer_cleanup(&writer);
  abuf_free(&dumpbuf);
  iVar1 = FINISH_TESTING();
  return iVar1;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  struct rfc5444_writer_message *msg;
  size_t i;

  abuf_init(&dumpbuf);

  for (i=0; i<sizeof(tlv_value_buffer); i++) {
    tlv_value_buffer[i] = i;
  }

  rfc5444_writer_init(&writer);

  rfc5444_writer_register_target(&writer, &small_if);
  rfc5444_writer_register_target(&writer, &large_if);

  msg = rfc5444_writer_register_message(&writer, MSG_TYPE, false);
  msg->addMessageHeader = addMessageHeader;
  msg->finishMessageHeader = finishMessageHeader;

  rfc5444_writer_register_msgcontentprovider(&writer, &cpr, addrtlvs, ARRAYSIZE(addrtlvs));

  BEGIN_TESTING(clear_elements);

  test_frag_80_1();
  test_frag_80_2();
  test_frag_50_3();

  rfc5444_writer_cleanup(&writer);

  abuf_free(&dumpbuf);
  return FINISH_TESTING();
}